

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker>
helics::BrokerFactory::create(CoreType type,string_view brokerName,int argc,char **argv)

{
  string_view name;
  bool bVar1;
  undefined1 uVar2;
  element_type *peVar3;
  undefined8 uVar4;
  char *in_RCX;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  __sv_type _Var5;
  shared_ptr<helics::Broker> sVar6;
  CoreType newType;
  string newName;
  shared_ptr<helics::Broker> *broker;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  string_view in_stack_ffffffffffffff28;
  CoreType in_stack_ffffffffffffff4c;
  uint7 in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *local_a0;
  char **in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  CoreType in_stack_ffffffffffffffcc;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this = in_RDI;
  local_18._M_len = (size_t)in_RDX;
  local_18._M_str = in_RCX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  if ((in_ESI == 0x65) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), bVar1)) {
    helics::core::extractCoreType_abi_cxx11_(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
    std::tie<helics::CoreType,std::__cxx11::string>
              (&in_RDI->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this,in_RDI);
    std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x521557);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if ((bVar1) &&
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x521577)
       , !bVar1)) {
      _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      in_stack_ffffffffffffff58 = (char *)_Var5._M_len;
      local_a0 = _Var5._M_str;
      local_18._M_str = local_a0;
      local_18._M_len = (size_t)in_stack_ffffffffffffff58;
    }
  }
  name._M_str = in_stack_ffffffffffffff58;
  name._M_len = (ulong)in_stack_ffffffffffffff50;
  makeBroker(in_stack_ffffffffffffff4c,name);
  peVar3 = std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x521614);
  (*peVar3->_vptr_Broker[9])(peVar3,(ulong)in_R8D,in_R9);
  uVar2 = registerBroker(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if ((bool)uVar2) {
    peVar3 = std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5216c1);
    (*peVar3->_vptr_Broker[2])();
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff10));
    sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<helics::Broker>)
           sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)in_RDI);
  RegistrationFailure::RegistrationFailure((RegistrationFailure *)this,in_stack_ffffffffffffff28);
  __cxa_throw(uVar4,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

std::shared_ptr<Broker> create(CoreType type, std::string_view brokerName, int argc, char* argv[])
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || brokerName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(argc, argv);
        if (brokerName.empty() && !newName.empty()) {
            brokerName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto broker = makeBroker(type, brokerName);
    broker->configureFromArgs(argc, argv);
    if (!registerBroker(broker, type)) {
        throw(helics::RegistrationFailure("unable to register broker"));
    }
    broker->connect();
    return broker;
}